

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::genGatherProgram
          (TextureBorderClampTest *this)

{
  GLSLVersion version;
  RenderContext *pRVar1;
  char *pcVar2;
  ostream *poVar3;
  ShaderProgram *this_00;
  ProgramSources *pPVar4;
  string local_350;
  ShaderSource local_330;
  ShaderSource local_308;
  ProgramSources local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  ostringstream local_1f0 [8];
  ostringstream fragSource;
  char *local_78;
  char *lookup;
  char *samplerType;
  string vtxSource;
  allocator<char> local_35;
  ApiType local_34;
  undefined1 local_30 [8];
  string glslVersionDecl;
  TextureBorderClampTest *this_local;
  
  glslVersionDecl.field_2._8_8_ = this;
  pRVar1 = Context::getRenderContext((this->super_TestCase).m_context);
  local_34.m_bits = (*pRVar1->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion((ContextType)local_34.m_bits);
  pcVar2 = glu::getGLSLVersionDeclaration(version);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,pcVar2,&local_35);
  std::allocator<char>::~allocator(&local_35);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplerType,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "\nin highp vec4 a_position;\nin highp vec2 a_texcoord;\nout highp vec2 v_texcoord;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_texcoord = a_texcoord;\n}\n"
                );
  std::__cxx11::ostringstream::ostringstream(local_1f0);
  if ((this->m_useShadowSampler & 1U) == 0) {
    switch(this->m_channelClass) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      lookup = "sampler2D";
      local_78 = "textureGather(u_sampler, v_texcoord)";
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      lookup = "isampler2D";
      local_78 = "vec4(textureGather(u_sampler, v_texcoord))";
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      lookup = "usampler2D";
      local_78 = "vec4(textureGather(u_sampler, v_texcoord))";
      break;
    default:
      lookup = "";
      local_78 = "";
    }
  }
  else {
    lookup = "sampler2DShadow";
    local_78 = "textureGather(u_sampler, v_texcoord, u_ref)";
  }
  std::operator+(&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "\nuniform highp ");
  poVar3 = std::operator<<((ostream *)local_1f0,(string *)&local_210);
  poVar3 = std::operator<<(poVar3,lookup);
  poVar3 = std::operator<<(poVar3,
                           " u_sampler;\nuniform highp vec4 u_colorScale;\nuniform highp vec4 u_colorBias;\n"
                          );
  pcVar2 = "";
  if ((this->m_useShadowSampler & 1U) != 0) {
    pcVar2 = "uniform highp float u_ref;\n";
  }
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,
                           "in highp vec2 v_texcoord;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = "
                          );
  poVar3 = std::operator<<(poVar3,local_78);
  std::operator<<(poVar3," * u_colorScale + u_colorBias;\n}\n");
  std::__cxx11::string::~string((string *)&local_210);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pRVar1 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_2e0);
  glu::VertexSource::VertexSource((VertexSource *)&local_308,(string *)&samplerType);
  pPVar4 = glu::ProgramSources::operator<<(&local_2e0,&local_308);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_330,&local_350);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_330);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar1,pPVar4);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  glu::VertexSource::~VertexSource((VertexSource *)&local_308);
  glu::ProgramSources::~ProgramSources(&local_2e0);
  std::__cxx11::ostringstream::~ostringstream(local_1f0);
  std::__cxx11::string::~string((string *)&samplerType);
  std::__cxx11::string::~string((string *)local_30);
  return this_00;
}

Assistant:

glu::ShaderProgram* TextureBorderClampTest::genGatherProgram (void) const
{
	const std::string	glslVersionDecl	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()));
	const std::string	vtxSource		= glslVersionDecl + "\n"
										"in highp vec4 a_position;\n"
										"in highp vec2 a_texcoord;\n"
										"out highp vec2 v_texcoord;\n"
										"void main()\n"
										"{\n"
										"	gl_Position = a_position;\n"
										"	v_texcoord = a_texcoord;\n"
										"}\n";
	const char*			samplerType;
	const char*			lookup;
	std::ostringstream	fragSource;

	if (m_useShadowSampler)
	{
		samplerType	= "sampler2DShadow";
		lookup		= "textureGather(u_sampler, v_texcoord, u_ref)";
	}
	else
	{
		switch (m_channelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				samplerType	= "sampler2D";
				lookup		= "textureGather(u_sampler, v_texcoord)";
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				samplerType	= "isampler2D";
				lookup		= "vec4(textureGather(u_sampler, v_texcoord))";
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				samplerType	= "usampler2D";
				lookup		= "vec4(textureGather(u_sampler, v_texcoord))";
				break;

			default:
				samplerType	= "";
				lookup		= "";
				DE_ASSERT(false);
		}
	}

	fragSource	<<	glslVersionDecl + "\n"
					"uniform highp " << samplerType << " u_sampler;\n"
					"uniform highp vec4 u_colorScale;\n"
					"uniform highp vec4 u_colorBias;\n"
				<<	((m_useShadowSampler) ? ("uniform highp float u_ref;\n") : (""))
				<<	"in highp vec2 v_texcoord;\n"
					"layout(location=0) out highp vec4 o_color;\n"
					"void main()\n"
					"{\n"
					"	o_color = " << lookup << " * u_colorScale + u_colorBias;\n"
					"}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vtxSource) << glu::FragmentSource(fragSource.str()));
}